

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<ExternConstantInfo,_false,_false>::grow_and_add
          (FastVector<ExternConstantInfo,_false,_false> *this,uint newSize,
          ExternConstantInfo *valPtr,uint elem)

{
  uint uVar1;
  ExternConstantInfo *pEVar2;
  ExternConstantInfo *pEVar3;
  long lVar4;
  
  pEVar2 = this->data;
  grow_no_destroy(this,newSize);
  for (lVar4 = 0; (ulong)elem * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    pEVar3 = this->data;
    uVar1 = this->count;
    this->count = uVar1 + 1;
    *(undefined4 *)((long)&pEVar3[uVar1].value + 4) =
         *(undefined4 *)((long)&valPtr->value + lVar4 + 4);
    *(undefined8 *)(pEVar3 + uVar1) = *(undefined8 *)((long)&valPtr->type + lVar4);
  }
  if (pEVar2 != (ExternConstantInfo *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}